

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_withTwoTestGroupAndOneFailingTest_TestShell::
~TEST_JUnitOutputTest_withTwoTestGroupAndOneFailingTest_TestShell
          (TEST_JUnitOutputTest_withTwoTestGroupAndOneFailingTest_TestShell *this)

{
  TEST_JUnitOutputTest_withTwoTestGroupAndOneFailingTest_TestShell *this_local;
  
  ~TEST_JUnitOutputTest_withTwoTestGroupAndOneFailingTest_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, withTwoTestGroupAndOneFailingTest)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FirstTest")
                .withTest("FailingTestName").thatFails("Test failed", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<testsuite errors=\"0\" failures=\"1\" hostname=\"localhost\" name=\"testGroupWithFailingTest\" tests=\"2\" time=\"0.000\" timestamp=\"1978-10-03T00:00:00\">\n", outputFile->line(2));
    STRCMP_EQUAL("<testcase classname=\"testGroupWithFailingTest\" name=\"FailingTestName\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(7));
    STRCMP_EQUAL("<failure message=\"thisfile:10: Test failed\" type=\"AssertionFailedError\">\n", outputFile->line(8));
}